

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

int onig_regset_replace(OnigRegSet *set,int at,regex_t *reg)

{
  int local_2c;
  int i;
  regex_t *reg_local;
  int at_local;
  OnigRegSet *set_local;
  
  if ((at < 0) || (set->n <= at)) {
    return -0x1e;
  }
  if (reg == (regex_t *)0x0) {
    onig_region_free(set->rs[at].region,1);
    for (local_2c = at; local_2c < set->n + -1; local_2c = local_2c + 1) {
      set->rs[local_2c].reg = set->rs[local_2c + 1].reg;
      set->rs[local_2c].region = set->rs[local_2c + 1].region;
    }
    set->n = set->n + -1;
  }
  else {
    if ((reg->options & 0x10) != 0) {
      return -0x1e;
    }
    if ((1 < set->n) && (reg->enc != set->enc)) {
      return -0x1e;
    }
    set->rs[at].reg = reg;
  }
  for (local_2c = 0; local_2c < set->n; local_2c = local_2c + 1) {
    update_regset_by_reg(set,set->rs[local_2c].reg);
  }
  return 0;
}

Assistant:

extern int
onig_regset_replace(OnigRegSet* set, int at, regex_t* reg)
{
  int i;

  if (at < 0 || at >= set->n)
    return ONIGERR_INVALID_ARGUMENT;

  if (IS_NULL(reg)) {
    onig_region_free(set->rs[at].region, 1);
    for (i = at; i < set->n - 1; i++) {
      set->rs[i].reg    = set->rs[i+1].reg;
      set->rs[i].region = set->rs[i+1].region;
    }
    set->n--;
  }
  else {
#ifdef USE_FIND_LONGEST_SEARCH_ALL_OF_RANGE
    if (OPTON_FIND_LONGEST(reg->options))
      return ONIGERR_INVALID_ARGUMENT;
#endif

    if (set->n > 1 && reg->enc != set->enc)
      return ONIGERR_INVALID_ARGUMENT;

    set->rs[at].reg = reg;
  }

  for (i = 0; i < set->n; i++)
    update_regset_by_reg(set, set->rs[i].reg);

  return 0;
}